

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexVerifierUtil.cpp
# Opt level: O2

float tcu::TexVerifierUtil::computeFloatingPointError(float value,int numAccurateBits)

{
  int exponent;
  Float<unsigned_int,_8,_23,_127,_3U> FVar1;
  Float<unsigned_int,_8,_23,_127,_3U> local_14;
  
  exponent = Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_14);
  FVar1 = Float<unsigned_int,_8,_23,_127,_3U>::construct
                    (1,exponent,~(-1 << (0x17U - (char)numAccurateBits & 0x1f)) | 0x800000);
  return (float)FVar1.m_value - (float)(exponent * 0x800000 + 0x3f800000);
}

Assistant:

float computeFloatingPointError (const float value, const int numAccurateBits)
{
	const int		numGarbageBits	= 23-numAccurateBits;
	const deUint32	mask			= (1u<<numGarbageBits)-1u;
	const int		exp				= tcu::Float32(value).exponent();

	return Float32::construct(+1, exp, (1u<<23) | mask).asFloat() - Float32::construct(+1, exp, 1u<<23).asFloat();
}